

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Update
          (PersistentStorageJson *this,Registrar *aValue)

{
  Status SVar1;
  string local_38;
  Registrar *local_18;
  Registrar *aValue_local;
  PersistentStorageJson *this_local;
  
  local_18 = aValue;
  aValue_local = (Registrar *)this;
  std::__cxx11::string::string((string *)&local_38,(string *)JSON_RGR_abi_cxx11_);
  SVar1 = UpdId<ot::commissioner::persistent_storage::Registrar>(this,aValue,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Update(Registrar const &aValue)
{
    return UpdId<Registrar>(aValue, JSON_RGR);
}